

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall tetgenmesh::initialdelaunay(tetgenmesh *this,point pa,point pb,point pc,point pd)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  tetrahedron *pppdVar4;
  tetrahedron *pppdVar5;
  int iVar6;
  tetrahedron *pppdVar7;
  int iVar8;
  tetrahedron *pppdVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  double dVar16;
  triface firsttet;
  triface tetopd;
  triface tetopc;
  triface tetopb;
  triface tetopa;
  triface local_80;
  triface local_70;
  triface local_60;
  triface local_50;
  triface local_40;
  
  local_80.tet = (tetrahedron *)0x0;
  local_80.ver = 0;
  local_40.tet = (tetrahedron *)0x0;
  local_40.ver = 0;
  local_50.tet = (tetrahedron *)0x0;
  local_50.ver = 0;
  local_60.tet = (tetrahedron *)0x0;
  local_60.ver = 0;
  local_70.tet = (tetrahedron *)0x0;
  local_70.ver = 0;
  if (2 < this->b->verbose) {
    lVar11 = (long)this->pointmarkindex;
    printf("      Create init tet (%d, %d, %d, %d)\n",(ulong)*(uint *)((long)pa + lVar11 * 4),
           (ulong)*(uint *)((long)pb + lVar11 * 4),(ulong)*(uint *)((long)pc + lVar11 * 4),
           (ulong)*(uint *)((long)pd + lVar11 * 4));
  }
  maketetrahedron(this,&local_80);
  iVar3 = local_80.ver;
  pppdVar4 = local_80.tet;
  uVar15 = (ulong)local_80.ver;
  local_80.tet[orgpivot[uVar15]] = (tetrahedron)pa;
  local_80.tet[destpivot[uVar15]] = (tetrahedron)pb;
  local_80.tet[apexpivot[uVar15]] = (tetrahedron)pc;
  local_80.tet[oppopivot[uVar15]] = (tetrahedron)pd;
  maketetrahedron(this,&local_40);
  iVar10 = local_40.ver;
  pppdVar9 = local_40.tet;
  lVar11 = (long)local_40.ver;
  local_40.tet[orgpivot[lVar11]] = (tetrahedron)pb;
  local_40.tet[destpivot[lVar11]] = (tetrahedron)pc;
  local_40.tet[apexpivot[lVar11]] = (tetrahedron)pd;
  local_40.tet[oppopivot[lVar11]] = (tetrahedron)this->dummypoint;
  maketetrahedron(this,&local_50);
  iVar8 = local_50.ver;
  pppdVar7 = local_50.tet;
  lVar12 = (long)local_50.ver;
  local_50.tet[orgpivot[lVar12]] = (tetrahedron)pc;
  local_50.tet[destpivot[lVar12]] = (tetrahedron)pa;
  local_50.tet[apexpivot[lVar12]] = (tetrahedron)pd;
  local_50.tet[oppopivot[lVar12]] = (tetrahedron)this->dummypoint;
  maketetrahedron(this,&local_60);
  iVar6 = local_60.ver;
  pppdVar5 = local_60.tet;
  lVar14 = (long)local_60.ver;
  local_60.tet[orgpivot[lVar14]] = (tetrahedron)pa;
  local_60.tet[destpivot[lVar14]] = (tetrahedron)pb;
  local_60.tet[apexpivot[lVar14]] = (tetrahedron)pd;
  local_60.tet[oppopivot[lVar14]] = (tetrahedron)this->dummypoint;
  maketetrahedron(this,&local_70);
  lVar13 = (long)local_70.ver;
  local_70.tet[orgpivot[lVar13]] = (tetrahedron)pb;
  local_70.tet[destpivot[lVar13]] = (tetrahedron)pa;
  local_70.tet[apexpivot[lVar13]] = (tetrahedron)pc;
  local_70.tet[oppopivot[lVar13]] = (tetrahedron)this->dummypoint;
  this->hullsize = this->hullsize + 4;
  pppdVar4[iVar3 & 3] = (tetrahedron)((long)bondtbl[uVar15][lVar13] | (ulong)local_70.tet);
  local_70.tet[local_70.ver & 3] = (tetrahedron)((long)bondtbl[lVar13][uVar15] | (ulong)pppdVar4);
  uVar1 = esymtbl[uVar15];
  pppdVar4[uVar1 & 3] = (tetrahedron)((long)bondtbl[(int)uVar1][lVar14] | (ulong)pppdVar5);
  pppdVar5[iVar6 & 3] = (tetrahedron)((long)bondtbl[lVar14][(int)uVar1] | (ulong)pppdVar4);
  uVar1 = enextesymtbl[uVar15];
  pppdVar4[uVar1 & 3] = (tetrahedron)((long)bondtbl[(int)uVar1][lVar11] | (ulong)pppdVar9);
  pppdVar9[iVar10 & 3] = (tetrahedron)((long)bondtbl[lVar11][(int)uVar1] | (ulong)pppdVar4);
  uVar1 = eprevesymtbl[uVar15];
  pppdVar4[uVar1 & 3] = (tetrahedron)((long)bondtbl[(int)uVar1][lVar12] | (ulong)pppdVar7);
  pppdVar7[iVar8 & 3] = (tetrahedron)((long)bondtbl[lVar12][(int)uVar1] | (ulong)pppdVar4);
  uVar1 = esymtbl[lVar14];
  uVar2 = esymtbl[lVar13];
  pppdVar5[uVar1 & 3] = (tetrahedron)((long)bondtbl[(int)uVar1][(int)uVar2] | (ulong)local_70.tet);
  local_70.tet[uVar2 & 3] = (tetrahedron)((long)bondtbl[(int)uVar2][(int)uVar1] | (ulong)pppdVar5);
  uVar1 = esymtbl[lVar11];
  uVar2 = eprevesymtbl[lVar13];
  pppdVar9[uVar1 & 3] = (tetrahedron)((long)bondtbl[(int)uVar1][(int)uVar2] | (ulong)local_70.tet);
  local_70.tet[uVar2 & 3] = (tetrahedron)((long)bondtbl[(int)uVar2][(int)uVar1] | (ulong)pppdVar9);
  uVar1 = esymtbl[lVar12];
  uVar2 = enextesymtbl[lVar13];
  pppdVar7[uVar1 & 3] = (tetrahedron)((long)bondtbl[(int)uVar1][(int)uVar2] | (ulong)local_70.tet);
  local_70.tet[uVar2 & 3] = (tetrahedron)((long)bondtbl[(int)uVar2][(int)uVar1] | (ulong)pppdVar7);
  uVar1 = eprevesymtbl[lVar14];
  uVar2 = enextesymtbl[lVar12];
  pppdVar5[uVar1 & 3] = (tetrahedron)((long)bondtbl[(int)uVar1][(int)uVar2] | (ulong)pppdVar7);
  pppdVar7[uVar2 & 3] = (tetrahedron)((long)bondtbl[(int)uVar2][(int)uVar1] | (ulong)pppdVar5);
  uVar1 = eprevesymtbl[lVar11];
  uVar2 = enextesymtbl[lVar14];
  pppdVar9[uVar1 & 3] = (tetrahedron)((long)bondtbl[(int)uVar1][(int)uVar2] | (ulong)pppdVar5);
  pppdVar5[uVar2 & 3] = (tetrahedron)((long)bondtbl[(int)uVar2][(int)uVar1] | (ulong)pppdVar9);
  uVar1 = eprevesymtbl[lVar12];
  uVar2 = enextesymtbl[lVar11];
  pppdVar7[uVar1 & 3] = (tetrahedron)((long)bondtbl[(int)uVar1][(int)uVar2] | (ulong)pppdVar9);
  pppdVar9[uVar2 & 3] = (tetrahedron)((long)bondtbl[(int)uVar2][(int)uVar1] | (ulong)pppdVar7);
  uVar1 = *(uint *)((long)pa + (long)this->pointmarkindex * 4 + 4);
  if (uVar1 < 0x100) {
    *(uint *)((long)pa + (long)this->pointmarkindex * 4 + 4) = uVar1 | 0x500;
  }
  uVar1 = *(uint *)((long)pb + (long)this->pointmarkindex * 4 + 4);
  if (uVar1 < 0x100) {
    *(uint *)((long)pb + (long)this->pointmarkindex * 4 + 4) = uVar1 | 0x500;
  }
  uVar1 = *(uint *)((long)pc + (long)this->pointmarkindex * 4 + 4);
  if (uVar1 < 0x100) {
    *(uint *)((long)pc + (long)this->pointmarkindex * 4 + 4) = uVar1 | 0x500;
  }
  uVar1 = *(uint *)((long)pd + (long)this->pointmarkindex * 4 + 4);
  if (uVar1 < 0x100) {
    *(uint *)((long)pd + (long)this->pointmarkindex * 4 + 4) = uVar1 | 0x500;
  }
  dVar16 = (double)(uVar15 | (ulong)pppdVar4);
  iVar3 = this->point2simindex;
  pa[iVar3] = dVar16;
  pb[iVar3] = dVar16;
  pc[iVar3] = dVar16;
  pd[iVar3] = dVar16;
  (this->recenttet).tet = pppdVar4;
  (this->recenttet).ver = local_80.ver;
  return;
}

Assistant:

void tetgenmesh::initialdelaunay(point pa, point pb, point pc, point pd)
{
  triface firsttet, tetopa, tetopb, tetopc, tetopd;
  triface worktet, worktet1;

  if (b->verbose > 2) {
    printf("      Create init tet (%d, %d, %d, %d)\n", pointmark(pa),
           pointmark(pb), pointmark(pc), pointmark(pd));
  }

  // Create the first tetrahedron.
  maketetrahedron(&firsttet);
  setvertices(firsttet, pa, pb, pc, pd);
  // Create four hull tetrahedra.
  maketetrahedron(&tetopa);
  setvertices(tetopa, pb, pc, pd, dummypoint);
  maketetrahedron(&tetopb);
  setvertices(tetopb, pc, pa, pd, dummypoint);
  maketetrahedron(&tetopc);
  setvertices(tetopc, pa, pb, pd, dummypoint);
  maketetrahedron(&tetopd);
  setvertices(tetopd, pb, pa, pc, dummypoint);
  hullsize += 4;

  // Connect hull tetrahedra to firsttet (at four faces of firsttet).
  bond(firsttet, tetopd);
  esym(firsttet, worktet);
  bond(worktet, tetopc); // ab
  enextesym(firsttet, worktet);
  bond(worktet, tetopa); // bc 
  eprevesym(firsttet, worktet);
  bond(worktet, tetopb); // ca

  // Connect hull tetrahedra together (at six edges of firsttet).
  esym(tetopc, worktet); 
  esym(tetopd, worktet1);
  bond(worktet, worktet1); // ab
  esym(tetopa, worktet);
  eprevesym(tetopd, worktet1);
  bond(worktet, worktet1); // bc
  esym(tetopb, worktet);
  enextesym(tetopd, worktet1);
  bond(worktet, worktet1); // ca
  eprevesym(tetopc, worktet);
  enextesym(tetopb, worktet1);
  bond(worktet, worktet1); // da
  eprevesym(tetopa, worktet);
  enextesym(tetopc, worktet1);
  bond(worktet, worktet1); // db
  eprevesym(tetopb, worktet);
  enextesym(tetopa, worktet1);
  bond(worktet, worktet1); // dc

  // Set the vertex type.
  if (pointtype(pa) == UNUSEDVERTEX) {
    setpointtype(pa, VOLVERTEX);
  }
  if (pointtype(pb) == UNUSEDVERTEX) {
    setpointtype(pb, VOLVERTEX);
  }
  if (pointtype(pc) == UNUSEDVERTEX) {
    setpointtype(pc, VOLVERTEX);
  }
  if (pointtype(pd) == UNUSEDVERTEX) {
    setpointtype(pd, VOLVERTEX);
  }

  setpoint2tet(pa, encode(firsttet));
  setpoint2tet(pb, encode(firsttet));
  setpoint2tet(pc, encode(firsttet));
  setpoint2tet(pd, encode(firsttet));

  // Remember the first tetrahedron.
  recenttet = firsttet;
}